

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O2

LY_ERR lyd_new_opaq(lyd_node *parent,ly_ctx *ctx,char *name,char *value,char *prefix,
                   char *module_name,lyd_node **node)

{
  int iVar1;
  LY_ERR LVar2;
  ly_ctx *plVar3;
  lys_module *plVar4;
  size_t value_len;
  char *pcVar5;
  lyd_node *ret;
  size_t local_50;
  long local_48;
  size_t local_40;
  size_t local_38;
  
  ret = (lyd_node *)0x0;
  if (parent == (lyd_node *)0x0 && ctx == (ly_ctx *)0x0) {
    pcVar5 = "parent || ctx";
    ctx = (ly_ctx *)0x0;
  }
  else if (parent == (lyd_node *)0x0 && node == (lyd_node **)0x0) {
    pcVar5 = "parent || node";
  }
  else if (name == (char *)0x0) {
    pcVar5 = "name";
  }
  else if (module_name == (char *)0x0) {
    pcVar5 = "module_name";
  }
  else {
    if ((prefix == (char *)0x0) || (iVar1 = strcmp(prefix,module_name), iVar1 == 0)) {
      if (parent == (lyd_node *)0x0 || ctx == (ly_ctx *)0x0) {
        if (ctx == (ly_ctx *)0x0) {
          if (parent->schema == (lysc_node *)0x0) {
            plVar4 = (lys_module *)&parent[2].schema;
          }
          else {
            plVar4 = parent->schema->module;
          }
          ctx = plVar4->ctx;
        }
      }
      else {
        if (parent->schema == (lysc_node *)0x0) {
          plVar3 = (ly_ctx *)parent[2].schema;
        }
        else {
          plVar3 = parent->schema->module->ctx;
        }
        if ((plVar3 != (ly_ctx *)0x0) && (plVar3 != ctx)) {
          ly_log(ctx,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
      if (value == (char *)0x0) {
        local_48 = 0;
        value = "";
      }
      else {
        iVar1 = strcmp(value,"[null]");
        local_48 = (ulong)(iVar1 == 0) << 6;
      }
      local_38 = strlen(name);
      if (prefix == (char *)0x0) {
        local_50 = 0;
      }
      else {
        local_50 = strlen(prefix);
      }
      local_40 = strlen(module_name);
      value_len = strlen(value);
      LVar2 = lyd_create_opaq(ctx,name,local_38,prefix,local_50,module_name,local_40,value,value_len
                              ,(ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,(uint32_t)local_48,&ret);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (parent != (lyd_node *)0x0) {
        lyd_insert_node(parent,(lyd_node **)0x0,ret,1);
      }
      if (node == (lyd_node **)0x0) {
        return LY_SUCCESS;
      }
      *node = ret;
      return LY_SUCCESS;
    }
    pcVar5 = "!prefix || !strcmp(prefix, module_name)";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"lyd_new_opaq");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_opaq(struct lyd_node *parent, const struct ly_ctx *ctx, const char *name, const char *value,
        const char *prefix, const char *module_name, struct lyd_node **node)
{
    struct lyd_node *ret = NULL;
    uint32_t hints = 0;

    LY_CHECK_ARG_RET(ctx, parent || ctx, parent || node, name, module_name, !prefix || !strcmp(prefix, module_name), LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(ctx, parent ? LYD_CTX(parent) : NULL, LY_EINVAL);

    if (!ctx) {
        ctx = LYD_CTX(parent);
    }
    if (!value) {
        value = "";
    } else if (!strcmp(value, "[null]")) {
        hints |= LYD_VALHINT_EMPTY;
    }

    LY_CHECK_RET(lyd_create_opaq(ctx, name, strlen(name), prefix, prefix ? strlen(prefix) : 0, module_name,
            strlen(module_name), value, strlen(value), NULL, LY_VALUE_JSON, NULL, hints, &ret));
    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_LAST);
    }

    if (node) {
        *node = ret;
    }
    return LY_SUCCESS;
}